

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_scathing(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  int idam;
  bool bVar2;
  int iVar3;
  CHAR_DATA *ach;
  AFFECT_DATA af;
  char buf [4608];
  
  send_to_char("You create violent, scorching gusts of wind to sweep across the area.\n\r",ch);
  act("Heat radiates from $n\'s fingertips as a scathing wind sweeps across the area.",ch,
      (void *)0x0,(void *)0x0,0);
  init_affect(&af);
  af.where = 0;
  af.type = (short)sn;
  af.aftype = 0;
  af.duration = 0;
  af.location = 0x12;
  af.modifier = -4;
  af.mod_name = 0;
  af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
  ach = ch->in_room->people;
  if (ach != (CHAR_DATA *)0x0) {
    af.level = (short)level;
    do {
      pCVar1 = ach->next_in_room;
      bVar2 = is_same_group(ach,ch);
      if (!bVar2) {
        bVar2 = is_safe(ch,ach);
        if (!bVar2) {
          bVar2 = is_same_cabal(ch,ach);
          if (!bVar2) {
            bVar2 = is_npc(ch);
            if (!bVar2) {
              bVar2 = is_npc(ach);
              if ((!bVar2) &&
                 ((ch->fighting == (CHAR_DATA *)0x0 || (ach->fighting == (CHAR_DATA *)0x0)))) {
                pers(ch,ach);
                snprintf(buf,0x1200,"Die, %s you sorcerous dog!");
                do_myell(ach,buf,ch);
              }
            }
            iVar3 = dice((int)((float)level * 0.66),9);
            bVar2 = saves_spell(level,ach,4);
            idam = iVar3 / 2;
            if (!bVar2) {
              idam = iVar3;
            }
            iVar3 = number_percent();
            if (iVar3 < 0x15) {
              bVar2 = is_affected(ach,sn);
              if (((!bVar2) && ((ach->act[0] & 0x4000) == 0)) && ((ach->form[0] & 0x100) == 0)) {
                act("The heated air sears $n\'s eyes, blinding $m!",ach,(void *)0x0,(void *)0x0,0);
                send_to_char("The heated air sears your eyes, blinding you!\n\r",ach);
                affect_to_char(ach,&af);
              }
            }
            damage_new(ch,ach,idam,-1,4,true,false,0,1,"scathing wind");
          }
        }
      }
      ach = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_scathing(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch, *vch_next;
	AFFECT_DATA af;
	int dam;
	char buf[MSL];

	send_to_char("You create violent, scorching gusts of wind to sweep across the area.\n\r", ch);
	act("Heat radiates from $n's fingertips as a scathing wind sweeps across the area.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.level = level;
	af.type = sn;
	af.aftype = AFT_SPELL;
	af.location = APPLY_HITROLL;
	af.modifier = -4;
	af.duration = 0;

	SET_BIT(af.bitvector, AFF_BLIND);
	af.mod_name = MOD_VISION;

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_same_group(vch, ch) || is_safe(ch, vch) || is_same_cabal(ch, vch))
			continue;

		if (!is_npc(ch) && !is_npc(vch) && (ch->fighting == nullptr || vch->fighting == nullptr))
		{
			std::snprintf(buf, static_cast<int>(MSL), "Die, %s you sorcerous dog!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}

		dam = dice((int)(.66 * (float)level), 9);

		if (saves_spell(level, vch, DAM_FIRE))
			dam /= 2;

		if (number_percent() <= 20
			&& !is_affected(vch, sn)
			&& !(IS_SET(vch->act, ACT_UNDEAD) || IS_SET(vch->form, FORM_UNDEAD)))
		{
			act("The heated air sears $n's eyes, blinding $m!", vch, 0, 0, TO_ROOM);
			send_to_char("The heated air sears your eyes, blinding you!\n\r", vch);
			affect_to_char(vch, &af);
		}

		damage_new(ch, vch, dam, TYPE_UNDEFINED, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "scathing wind");
	}
}